

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O2

int i2d_ECPKParameters(EC_GROUP *param_1,uchar **out)

{
  int iVar1;
  CBB cbb;
  
  if (param_1 == (EC_GROUP *)0x0) {
    ERR_put_error(0xf,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                  ,0x1c2);
  }
  else {
    iVar1 = CBB_init(&cbb,0);
    if ((iVar1 != 0) && (iVar1 = EC_KEY_marshal_curve_name(&cbb,(EC_GROUP *)param_1), iVar1 != 0)) {
      iVar1 = CBB_finish_i2d(&cbb,out);
      return iVar1;
    }
    CBB_cleanup(&cbb);
  }
  return -1;
}

Assistant:

int i2d_ECPKParameters(const EC_GROUP *group, uint8_t **outp) {
  if (group == NULL) {
    OPENSSL_PUT_ERROR(EC, ERR_R_PASSED_NULL_PARAMETER);
    return -1;
  }

  CBB cbb;
  if (!CBB_init(&cbb, 0) ||  //
      !EC_KEY_marshal_curve_name(&cbb, group)) {
    CBB_cleanup(&cbb);
    return -1;
  }
  return CBB_finish_i2d(&cbb, outp);
}